

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

CMbuffer cm_get_data_buf(CManager_conflict cm,ssize_t length)

{
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  long lVar4;
  ulong in_RSI;
  long in_RDI;
  timespec ts_6;
  timespec ts_5;
  char *t_1;
  timespec ts_4;
  char *t;
  timespec ts_3;
  timespec ts_2;
  timespec ts_1;
  timespec ts;
  CMbuffer tmp;
  int buffer_count;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  void *in_stack_fffffffffffffee0;
  FILE *pFVar5;
  ssize_t in_stack_ffffffffffffff00;
  void *in_stack_ffffffffffffff08;
  CManager_conflict in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  CMTraceType trace_type;
  CManager in_stack_ffffffffffffff20;
  timespec local_a8;
  timespec local_98;
  void *local_88;
  timespec local_80;
  void *local_70;
  timespec local_68;
  timespec local_58;
  timespec local_48;
  timespec local_38;
  CMbuffer local_28;
  uint local_1c;
  ulong local_18;
  long local_10;
  
  local_1c = 0;
  local_28 = *(CMbuffer *)(in_RDI + 0xe8);
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffff20,
                         (CMTraceType)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    if (iVar1 == 0) goto LAB_00114f80;
  }
  else if (CMtrace_val[9] == 0) goto LAB_00114f80;
  if (CMtrace_PID != 0) {
    pFVar5 = *(FILE **)(local_10 + 0x120);
    _Var2 = getpid();
    pVar3 = pthread_self();
    fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_38);
    fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
  }
  fprintf(*(FILE **)(local_10 + 0x120),"cm_get_data_buf called with len %zu\n",local_18);
LAB_00114f80:
  fflush(*(FILE **)(local_10 + 0x120));
  for (; local_28 != (CMbuffer)0x0; local_28 = *(CMbuffer *)((long)local_28 + 0x18)) {
    iVar1 = CMtrace_val[9];
    if (*(long *)(local_10 + 0x120) == 0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffff20,
                           (CMTraceType)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = *(FILE **)(local_10 + 0x120);
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_48);
        fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
      }
      in_stack_fffffffffffffed8 = *(undefined4 *)((long)local_28 + 0x10);
      fprintf(*(FILE **)(local_10 + 0x120),"  buffer %d %p, size is %zd, data %p, ref_count %d\n",
              (ulong)local_1c,local_28,*(undefined8 *)((long)local_28 + 8),local_28->buffer);
    }
    fflush(*(FILE **)(local_10 + 0x120));
    local_1c = local_1c + 1;
  }
  local_28 = *(CMbuffer *)(local_10 + 0xe8);
  local_1c = 0;
  for (; trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffff18 >> 0x20),
      local_28 != (CMbuffer)0x0; local_28 = *(CMbuffer *)((long)local_28 + 0x18)) {
    if (*(int *)((long)local_28 + 0x10) < 0) {
      iVar1 = CMtrace_val[9];
      if (*(long *)(local_10 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffff20,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar5 = *(FILE **)(local_10 + 0x120);
          _Var2 = getpid();
          pVar3 = pthread_self();
          fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_58);
          fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
        }
        fprintf(*(FILE **)(local_10 + 0x120),
                "cm_get_data_buf buffer %p, ref_count is %d, should not be negative\n",local_28,
                (ulong)*(uint *)((long)local_28 + 0x10));
      }
      fflush(*(FILE **)(local_10 + 0x120));
    }
    local_1c = local_1c + 1;
  }
  for (local_28 = *(CMbuffer *)(local_10 + 0xe8); local_28 != (CMbuffer)0x0;
      local_28 = local_28->next) {
    if (((local_28->ref_count < 1) && (local_18 <= local_28->size)) &&
       (local_28->size / 10 < local_18)) {
      iVar1 = CMtrace_val[9];
      if (*(long *)(local_10 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffff20,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar5 = *(FILE **)(local_10 + 0x120);
          _Var2 = getpid();
          lVar4 = (long)_Var2;
          pVar3 = pthread_self();
          fprintf(pFVar5,"P%lxT%lx - ",lVar4,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_68);
          fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",local_68.tv_sec,local_68.tv_nsec);
        }
        fprintf(*(FILE **)(local_10 + 0x120),
                "cm_get_data_buf called len %zu, return existing %p, next %p, count %d\n",local_18,
                local_28,local_28->next,(ulong)local_1c);
      }
      fflush(*(FILE **)(local_10 + 0x120));
      local_28->ref_count = 1;
      return local_28;
    }
  }
  for (local_28 = *(CMbuffer *)(local_10 + 0xe8); local_28 != (CMbuffer)0x0;
      local_28 = local_28->next) {
    if ((local_28->ref_count < 1) && (local_18 <= local_28->size)) {
      local_70 = INT_CMrealloc(in_stack_fffffffffffffee0,
                               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      if (local_70 == (void *)0x0) {
        return (CMbuffer)0x0;
      }
      local_28->buffer = local_70;
      local_28->size = local_18;
      local_28->ref_count = 1;
      iVar1 = CMtrace_val[9];
      if (*(long *)(local_10 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffff20,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar5 = *(FILE **)(local_10 + 0x120);
          _Var2 = getpid();
          lVar4 = (long)_Var2;
          pVar3 = pthread_self();
          fprintf(pFVar5,"P%lxT%lx - ",lVar4,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_80);
          fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",local_80.tv_sec,local_80.tv_nsec);
        }
        fprintf(*(FILE **)(local_10 + 0x120),"      cm_get_data_buf resizing down!  return is %p\n",
                local_28);
      }
      fflush(*(FILE **)(local_10 + 0x120));
      return local_28;
    }
  }
  local_28 = *(CMbuffer *)(local_10 + 0xe8);
  while( true ) {
    if (local_28 == (CMbuffer)0x0) {
      INT_CMmalloc((size_t)in_stack_fffffffffffffee0);
      local_28 = cm_create_transport_buffer
                           (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff00);
      local_28->ref_count = 1;
      local_28->next = *(_CMbuffer **)(local_10 + 0xe8);
      *(CMbuffer *)(local_10 + 0xe8) = local_28;
      iVar1 = CMtrace_val[9];
      if (*(long *)(local_10 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffff20,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar5 = *(FILE **)(local_10 + 0x120);
          _Var2 = getpid();
          pVar3 = pthread_self();
          fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_a8);
          fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",local_a8.tv_sec,local_a8.tv_nsec);
        }
        fprintf(*(FILE **)(local_10 + 0x120),
                "cm_get_data_buf create new len %zu, return %p, count %d\n",local_18,local_28,
                (ulong)local_1c);
      }
      fflush(*(FILE **)(local_10 + 0x120));
      return local_28;
    }
    if ((local_28->ref_count < 1) && (local_28->size <= local_18)) break;
    local_28 = local_28->next;
  }
  local_88 = INT_CMrealloc(in_stack_fffffffffffffee0,
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (local_88 == (void *)0x0) {
    return (CMbuffer)0x0;
  }
  local_28->buffer = local_88;
  local_28->size = local_18;
  local_28->ref_count = 1;
  iVar1 = CMtrace_val[9];
  if (*(long *)(local_10 + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffff20,trace_type);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      pFVar5 = *(FILE **)(local_10 + 0x120);
      _Var2 = getpid();
      lVar4 = (long)_Var2;
      pVar3 = pthread_self();
      fprintf(pFVar5,"P%lxT%lx - ",lVar4,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_98);
      fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",local_98.tv_sec,local_98.tv_nsec);
    }
    fprintf(*(FILE **)(local_10 + 0x120),"      cm_get_data_buf resizingup!  return is %p\n",
            local_28);
  }
  fflush(*(FILE **)(local_10 + 0x120));
  return local_28;
}

Assistant:

extern CMbuffer
 cm_get_data_buf(CManager cm, ssize_t length)  
 {
     int buffer_count = 0;
     CMbuffer tmp = cm->cm_buffer_list;

     CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf called with len %zu\n",
		 length);
     while (tmp != NULL) {
	 CMtrace_out(cm, CMBufferVerbose, "  buffer %d %p, size is %zd, data %p, ref_count %d\n",
		     buffer_count, tmp, tmp->size, tmp->buffer, tmp->ref_count);
	 buffer_count++;
	 tmp = tmp->next;
     }

     tmp = cm->cm_buffer_list;
     buffer_count = 0;
     /* first baseline consistency check */
     while (tmp != NULL) {
	 if (tmp->ref_count < 0) {
	     CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf buffer %p, ref_count is %d, should not be negative\n", tmp, tmp->ref_count);
	 }
	 buffer_count++;
	 tmp = tmp->next;
     }
     /* first look for a buffer big enough, but not too big */
     tmp = cm->cm_buffer_list;
     while (tmp != NULL) {
	 if (tmp->ref_count <= 0) {
	     if ((tmp->size >= (size_t)length) && ((tmp->size/10) < (size_t)length)) {
		 CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf called len %zu, return existing %p, next %p, count %d\n",
			     length, tmp, tmp->next, buffer_count);
		 tmp->ref_count = 1;
		 return tmp;
	     }
	 }
	 tmp = tmp->next;
     }		
     /* ok, we'll settle for way too big, but realloc it down */
     tmp = cm->cm_buffer_list;
     while (tmp != NULL) {
	 if (tmp->ref_count <= 0) {
	     if ((tmp->size >= (size_t)length)) {
		 char *t = INT_CMrealloc(tmp->buffer, length);
		 if (t == NULL) {
		     return NULL;
		 }
		 tmp->buffer = t;
		 tmp->size = length;
		 tmp->ref_count = 1;
		 CMtrace_out(cm, CMBufferVerbose, "      cm_get_data_buf resizing down!  return is %p\n", tmp);
		 return tmp;
	     }
	 }
	 tmp = tmp->next;
     }		
     tmp = cm->cm_buffer_list;
     /* well, look for a small one to realloc up */
     while (tmp != NULL) {
	 if (tmp->ref_count <= 0) {
	     if (tmp->size <= (size_t)length) {
		 char *t = INT_CMrealloc(tmp->buffer, length);
		 if (t == NULL) {
		     return NULL;
		 }
		 tmp->buffer = t;
		 tmp->size = length;
		 tmp->ref_count = 1;
		 CMtrace_out(cm, CMBufferVerbose, "      cm_get_data_buf resizingup!  return is %p\n", tmp);
		 return tmp;
	     }
	 }
	 tmp = tmp->next;
     }
     tmp = cm_create_transport_buffer(cm, INT_CMmalloc(length), length);
     tmp->ref_count = 1;
     tmp->next = cm->cm_buffer_list;
     cm->cm_buffer_list = tmp;
     CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf create new len %zu, return %p, count %d\n",
		 length, tmp, buffer_count);
     return tmp;
 }